

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O1

shared_ptr<i1> __thiscall
boost::ext::di::v1_3_0::scopes::instance::
scope<boost::ext::di::v1_3_0::aux::type_list<i1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>,_int>
::
injector_impl<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
::
create<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
::impl(create<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
       *this,injector__<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>
             *object)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&> sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<i1> sVar3;
  scope_impl<impl1,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> local_11;
  provider<boost::ext::di::v1_3_0::aux::pair<impl1,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  local_10;
  
  local_10.injector_ =
       (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
        *)(object + 2);
  sVar2 = singleton::scope_impl<impl1,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
          create_impl<impl1,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl1,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
                    (&local_11,&local_10);
  *(element_type **)this =
       ((sVar2.object)->super___shared_ptr<impl1,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = ((sVar2.object)->super___shared_ptr<impl1,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar3.super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<i1>)sVar3.super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static T impl(const injector__<named<TName, T>>* object) {
          using type = aux::type<aux::conditional_t<aux::is_same<TName, no_name>::value, T, named<TName, T>>>;
          return static_cast<const core::injector__<TInjector>&>(static_cast<const injector_impl*>(object)->injector_)
              .create_successful_impl(type{});
        }